

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O1

DelimitedSection *
soul::HTMLGenerator::findDelimitedSection
          (DelimitedSection *__return_storage_ptr__,string_view text,string_view delimiter)

{
  size_t startPos;
  char cVar1;
  CharType CVar2;
  CharType CVar3;
  CharType CVar4;
  CharType CVar5;
  size_t sVar6;
  size_t sVar7;
  size_type sVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  
  sVar8 = delimiter._M_len;
  pcVar9 = text._M_str;
  uVar10 = text._M_len;
  sVar6 = findDelimiter(text,delimiter,0);
  if (sVar6 != 0xffffffffffffffff) {
    startPos = sVar6 + sVar8;
    sVar7 = findDelimiter(text,delimiter,startPos);
    if (sVar7 != 0xffffffffffffffff) {
      if (sVar6 - 1 < uVar10) {
        cVar1 = pcVar9[sVar6 - 1];
      }
      else {
        cVar1 = '\0';
      }
      CVar2 = getCharType(cVar1);
      if (startPos < uVar10) {
        cVar1 = pcVar9[startPos];
      }
      else {
        cVar1 = '\0';
      }
      CVar3 = getCharType(cVar1);
      if (sVar7 - 1 < uVar10) {
        cVar1 = pcVar9[sVar7 - 1];
      }
      else {
        cVar1 = '\0';
      }
      CVar4 = getCharType(cVar1);
      uVar11 = sVar7 + sVar8;
      if (uVar11 < uVar10) {
        cVar1 = pcVar9[uVar11];
      }
      else {
        cVar1 = '\0';
      }
      CVar5 = getCharType(cVar1);
      if ((((CVar4 != whitespace) && (CVar3 != whitespace)) && (CVar2 != text)) && (CVar5 != text))
      {
        __return_storage_ptr__->outerStart = sVar6;
        __return_storage_ptr__->outerEnd = uVar11;
        __return_storage_ptr__->delimiterLength = sVar8;
        return __return_storage_ptr__;
      }
    }
  }
  __return_storage_ptr__->outerStart = 0;
  __return_storage_ptr__->outerEnd = 0;
  __return_storage_ptr__->delimiterLength = 0;
  return __return_storage_ptr__;
}

Assistant:

static DelimitedSection findDelimitedSection (std::string_view text, std::string_view delimiter)
    {
        auto start = findDelimiter (text, delimiter, 0);

        if (start != std::string_view::npos)
        {
            auto end = findDelimiter (text, delimiter, start + delimiter.length());

            if (end != std::string_view::npos)
            {
                auto preStart  = getCharType (getChar (text, start - 1));
                auto postStart = getCharType (getChar (text, start + delimiter.length()));

                auto preEnd  = getCharType (getChar (text, end - 1));
                auto postEnd = getCharType (getChar (text, end + delimiter.length()));

                if (preStart != CharType::text
                     && postEnd != CharType::text
                     && postStart != CharType::whitespace
                     && preEnd != CharType::whitespace)
                    return { start, end + delimiter.length(), delimiter.length() };
            }
        }

        return {};
    }